

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_count_gt.cpp
# Opt level: O1

void __thiscall IsingFreeEnergy_SquareCount0_Test::TestBody(IsingFreeEnergy_SquareCount0_Test *this)

{
  fvar<double,_2UL> beta;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL> h;
  uint in_ECX;
  char *pcVar1;
  AssertionResult gtest_ar;
  get_type_at<fvar<double,_2UL>,_sizeof___(Orders)> b0;
  promote<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
  f;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  AssertHelper local_c0;
  internal local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  double local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  double local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  promote<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
  local_50;
  
  local_90 = convert<double>("1.5");
  local_98 = convert<double>("2.5");
  local_a8 = convert<double>("2");
  local_a8 = 1.0 / local_a8;
  uStack_a0 = 0;
  uStack_60 = 0x3ff0000000000000;
  uStack_58 = 0;
  local_88 = 0;
  uStack_80 = 0x3ff0000000000000;
  local_78 = 0;
  beta.v._M_elems[1] = 1.0;
  beta.v._M_elems[0] = local_a8;
  beta.v._M_elems[2] = 0.0;
  h.v._M_elems[0].v._M_elems[2] = 0.0;
  h.v._M_elems[0].v._M_elems[0] = (double)SUB168(ZEXT816(0x3ff0000000000000) << 0x40,0);
  h.v._M_elems[0].v._M_elems[1] = (double)SUB168(ZEXT816(0x3ff0000000000000) << 0x40,8);
  local_68 = local_a8;
  ising::free_energy::square::
  finite_count<unsigned_int,double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,0ul>>
            (&local_50,(square *)0x4,4,in_ECX,local_90,local_98,beta,h);
  testing::internal::CmpHelperFloatingPointEQ<double>
            (local_b8,"-4.087359662653047e+00","free_energy(f, beta, h)",-4.087359662653047,
             local_50.v._M_elems[0].v._M_elems[0]);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]exact/ising/free_energy/square_count_gt.cpp"
               ,0x27,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            (local_b8,"-3.994108759068211e+00","energy(f, beta, h)",-3.994108759068211,
             local_50.v._M_elems[1].v._M_elems[0] * local_a8 + local_50.v._M_elems[0].v._M_elems[0])
  ;
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]exact/ising/free_energy/square_count_gt.cpp"
               ,0x28,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            (local_b8,"2.452622208849045e-02","specific_heat(f, beta, h)",0.02452622208849045,
             -local_a8 * local_a8 *
             (local_50.v._M_elems[1].v._M_elems[0] + local_50.v._M_elems[1].v._M_elems[0] +
             (local_50.v._M_elems[2].v._M_elems[0] + local_50.v._M_elems[2].v._M_elems[0]) *
             local_a8));
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]exact/ising/free_energy/square_count_gt.cpp"
               ,0x29,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            (local_b8,"1.597700713244840e+01","magnetization2(f, beta, h)",15.9770071324484,
             (local_50.v._M_elems[0].v._M_elems[2] * -2.0) / local_a8);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]exact/ising/free_energy/square_count_gt.cpp"
               ,0x2a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  return;
}

Assistant:

TEST(IsingFreeEnergy, SquareCount0) {
  typedef double real_t;
  unsigned Lx = 4;
  unsigned Ly = 4;
  auto Jx = convert<real_t>("1.5");
  auto Jy = convert<real_t>("2.5");
  auto t = convert<real_t>("2");
  auto vars = boost::math::differentiation::make_ftuple<real_t, 2, 2>(1 / t, 0);
  auto& beta = std::get<0>(vars);
  auto& h = std::get<1>(vars);
  auto f = square::finite_count(Lx, Ly, Jx, Jy, beta, h);
  EXPECT_DOUBLE_EQ(-4.087359662653047e+00, free_energy(f, beta, h));
  EXPECT_DOUBLE_EQ(-3.994108759068211e+00, energy(f, beta, h));
  EXPECT_DOUBLE_EQ(2.452622208849045e-02, specific_heat(f, beta, h));
  EXPECT_DOUBLE_EQ(1.597700713244840e+01, magnetization2(f, beta, h));
}